

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdUVTexture *shader,uint32_t indent)

{
  TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *attr;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
  *attr_00;
  TypedAttributeWithFallback<tinyusdz::value::color4f> *attr_01;
  tinyusdz *ptVar1;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *attr_02;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *pTVar2;
  TypedTerminalAttribute<float> *pTVar3;
  uint32_t indent_00;
  uint32_t in_R8D;
  string local_570;
  allocator local_549;
  undefined1 local_548 [32];
  string local_528;
  allocator local_501;
  string local_500;
  string local_4e0;
  allocator local_4b9;
  string local_4b8;
  string local_498;
  allocator local_471;
  string local_470;
  string local_450;
  allocator local_429;
  string local_428;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  string local_3c0;
  allocator local_399;
  string local_398;
  string local_378;
  allocator local_351;
  string local_350;
  string local_330;
  allocator local_309;
  undefined1 local_308 [32];
  string local_2e8;
  allocator local_2c1;
  undefined1 local_2c0 [32];
  string local_2a0;
  allocator local_279;
  string local_278;
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  UsdUVTexture *shader_local;
  
  local_1c = (uint32_t)shader;
  ptStack_18 = this;
  shader_local = (UsdUVTexture *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  attr = (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)(ptStack_18 + 0x730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"inputs:file",&local_1e9);
  print_typed_attr<tinyusdz::value::AssetPath>(&local_1c8,attr,&local_1e8,local_1c);
  std::operator<<(aoStack_198,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  attr_00 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
             *)(ptStack_18 + 0x13c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"inputs:sourceColorSpace",&local_231);
  print_typed_token_attr<tinyusdz::UsdUVTexture::SourceColorSpace>
            (&local_210,attr_00,&local_230,local_1c);
  std::operator<<(aoStack_198,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  attr_01 = (TypedAttributeWithFallback<tinyusdz::value::color4f> *)(ptStack_18 + 0x1178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"inputs:fallback",&local_279);
  print_typed_attr<tinyusdz::value::color4f>(&local_258,attr_01,&local_278,local_1c);
  std::operator<<(aoStack_198,(string *)&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  ptVar1 = ptStack_18 + 0x18a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_2c0,"inputs:bias",&local_2c1);
  print_typed_attr<std::array<float,4ul>>
            ((string *)(local_2c0 + 0x20),ptVar1,
             (TypedAttributeWithFallback<std::array<float,_4UL>_> *)local_2c0,
             (string *)(ulong)local_1c,in_R8D);
  std::operator<<(aoStack_198,(string *)(local_2c0 + 0x20));
  std::__cxx11::string::~string((string *)(local_2c0 + 0x20));
  std::__cxx11::string::~string((string *)local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  ptVar1 = ptStack_18 + 0x1650;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_308,"inputs:scale",&local_309);
  print_typed_attr<std::array<float,4ul>>
            ((string *)(local_308 + 0x20),ptVar1,
             (TypedAttributeWithFallback<std::array<float,_4UL>_> *)local_308,
             (string *)(ulong)local_1c,in_R8D);
  std::operator<<(aoStack_198,(string *)(local_308 + 0x20));
  std::__cxx11::string::~string((string *)(local_308 + 0x20));
  std::__cxx11::string::~string((string *)local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  attr_02 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *)
            (ptStack_18 + 0x9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"inputs:st",&local_351);
  print_typed_attr<tinyusdz::value::texcoord2f>(&local_330,attr_02,&local_350,local_1c);
  std::operator<<(aoStack_198,(string *)&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *)
           (ptStack_18 + 0xc68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"inputs:wrapT",&local_399);
  print_typed_token_attr<tinyusdz::UsdUVTexture::Wrap>(&local_378,pTVar2,&local_398,local_1c);
  std::operator<<(aoStack_198,(string *)&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  pTVar2 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *)
           (ptStack_18 + 0xef0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e0,"inputs:wrapS",&local_3e1);
  print_typed_token_attr<tinyusdz::UsdUVTexture::Wrap>(&local_3c0,pTVar2,&local_3e0,local_1c);
  std::operator<<(aoStack_198,(string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  pTVar3 = (TypedTerminalAttribute<float> *)(ptStack_18 + 0x1af0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_428,"outputs:r",&local_429);
  print_typed_terminal_attr<float>(&local_408,pTVar3,&local_428,local_1c);
  std::operator<<(aoStack_198,(string *)&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  pTVar3 = (TypedTerminalAttribute<float> *)(ptStack_18 + 0x1d20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_470,"outputs:g",&local_471);
  print_typed_terminal_attr<float>(&local_450,pTVar3,&local_470,local_1c);
  std::operator<<(aoStack_198,(string *)&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  pTVar3 = (TypedTerminalAttribute<float> *)(ptStack_18 + 0x1f50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b8,"outputs:b",&local_4b9);
  print_typed_terminal_attr<float>(&local_498,pTVar3,&local_4b8,local_1c);
  std::operator<<(aoStack_198,(string *)&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  pTVar3 = (TypedTerminalAttribute<float> *)(ptStack_18 + 0x2180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_500,"outputs:a",&local_501);
  print_typed_terminal_attr<float>(&local_4e0,pTVar3,&local_500,local_1c);
  std::operator<<(aoStack_198,(string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  ptVar1 = ptStack_18 + 0x23b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_548,"outputs:rgb",&local_549);
  indent_00 = local_1c;
  print_typed_terminal_attr<std::array<float,3ul>>
            ((string *)(local_548 + 0x20),ptVar1,
             (TypedTerminalAttribute<std::array<float,_3UL>_> *)local_548,(string *)(ulong)local_1c,
             in_R8D);
  std::operator<<(aoStack_198,(string *)(local_548 + 0x20));
  std::__cxx11::string::~string((string *)(local_548 + 0x20));
  std::__cxx11::string::~string((string *)local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  print_common_shader_params_abi_cxx11_
            (&local_570,ptStack_18,(ShaderNode *)(ulong)local_1c,indent_00);
  std::operator<<(aoStack_198,(string *)&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string print_shader_params(const UsdUVTexture &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_typed_attr(shader.file, "inputs:file", indent);

  ss << print_typed_token_attr(shader.sourceColorSpace,
                               "inputs:sourceColorSpace", indent);

  ss << print_typed_attr(shader.fallback, "inputs:fallback", indent);

  ss << print_typed_attr(shader.bias, "inputs:bias", indent);
  ss << print_typed_attr(shader.scale, "inputs:scale", indent);

  ss << print_typed_attr(shader.st, "inputs:st", indent);
  ss << print_typed_token_attr(shader.wrapS, "inputs:wrapT", indent);
  ss << print_typed_token_attr(shader.wrapT, "inputs:wrapS", indent);

  ss << print_typed_terminal_attr(shader.outputsR, "outputs:r", indent);
  ss << print_typed_terminal_attr(shader.outputsG, "outputs:g", indent);
  ss << print_typed_terminal_attr(shader.outputsB, "outputs:b", indent);
  ss << print_typed_terminal_attr(shader.outputsA, "outputs:a", indent);
  ss << print_typed_terminal_attr(shader.outputsRGB, "outputs:rgb", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}